

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

double wabt_convert_int64_to_double(int64_t x)

{
  return (double)x;
}

Assistant:

double wabt_convert_int64_to_double(int64_t x) {
#if COMPILER_IS_MSVC && _M_IX86
  double result;
  __asm fild x;
  __asm fstp result;
  return result;
#else
  return static_cast<double>(x);
#endif
}